

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instr.cpp
# Opt level: O3

ScalarFunction * duckdb::InstrFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_b9;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  code *local_a0;
  LogicalType local_98 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_80;
  LogicalType local_68 [24];
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  
  duckdb::LogicalType::LogicalType(local_50,VARCHAR);
  duckdb::LogicalType::LogicalType(local_38,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_50;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_80,__l,&local_b9);
  duckdb::LogicalType::LogicalType(local_98,BIGINT);
  local_b0 = 0;
  local_b8 = ScalarFunction::
             BinaryFunction<duckdb::string_t,duckdb::string_t,long,duckdb::InstrOperator>;
  local_a0 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_68,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_68);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  duckdb::LogicalType::~LogicalType(local_98);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_80);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_50 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return in_RDI;
}

Assistant:

ScalarFunction InstrFun::GetFunction() {
	return ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::BIGINT,
	                      ScalarFunction::BinaryFunction<string_t, string_t, int64_t, InstrOperator>, nullptr, nullptr,
	                      InStrPropagateStats);
}